

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  ushort *puVar1;
  string *psVar2;
  pointer __s1;
  size_type sVar3;
  FieldDescriptor *pFVar4;
  OneofDescriptor *pOVar5;
  EnumDescriptor *pEVar6;
  MessageOptions *pMVar7;
  ulong uVar8;
  int iVar9;
  Options *pOVar10;
  Nonnull<char_*> pcVar11;
  FieldGeneratorBase *pFVar12;
  Descriptor *pDVar13;
  Nonnull<const_char_*> pcVar14;
  ulong uVar15;
  char *pcVar16;
  Descriptor **ppDVar17;
  MessageOptions **ppMVar18;
  size_t sVar19;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *pFVar20;
  size_type __rlen;
  csharp *pcVar21;
  ulong uVar22;
  char *in_R9;
  long lVar23;
  long lVar24;
  EnumDescriptor **ppEVar25;
  long lVar26;
  bool bVar27;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  string_view text_23;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  string_view input;
  string_view input_00;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  string_view text_33;
  EnumGenerator enumGenerator;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_120 [48];
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  long local_a0;
  string local_98;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_78;
  AlphaNum local_60;
  FileDescriptor *descriptor;
  
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  puVar1 = (ushort *)(this->descriptor_->all_names_).payload_;
  ppEVar25 = &enumGenerator.descriptor_;
  enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar25;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&enumGenerator,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_120,&vars,(char (*) [11])0x133b59e);
  std::__cxx11::string::operator=((string *)(local_120._8_8_ + 0x10),(string *)&enumGenerator);
  if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      ppEVar25) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)&(enumGenerator.descriptor_)->field_0x1);
  }
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&enumGenerator,&this->super_SourceGeneratorBase);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_120,&vars,(char (*) [13])"access_level");
  std::__cxx11::string::operator=((string *)(local_120._8_8_ + 0x10),(string *)&enumGenerator);
  if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      ppEVar25) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)&(enumGenerator.descriptor_)->field_0x1);
  }
  pOVar10 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  WriteMessageDocComment(printer,pOVar10,this->descriptor_);
  if ((this->descriptor_->options_->field_0)._impl_.deprecated_ == true) {
    text._M_str = "[global::System.ObsoleteAttribute]\n";
    text._M_len = 0x23;
    io::Printer::Print<>(printer,text);
  }
  AddSerializableAttribute(this,printer);
  text_00._M_str = "[global::System.Diagnostics.DebuggerDisplayAttribute(\"{ToString(),nq}\")]\n";
  text_00._M_len = 0x49;
  io::Printer::Print<>(printer,text_00);
  text_18._M_str = "$access_level$ sealed partial class $class_name$ : ";
  text_18._M_len = 0x33;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_18);
  bVar27 = this->has_extension_ranges_ != false;
  sVar19 = 0x1b;
  if (bVar27) {
    sVar19 = 0x25;
  }
  pcVar16 = "pb::IMessage<$class_name$>\n";
  if (bVar27) {
    pcVar16 = "pb::IExtendableMessage<$class_name$>\n";
  }
  text_19._M_str = pcVar16;
  text_19._M_len = sVar19;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_19);
  text_01._M_str = "#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n";
  text_01._M_len = 0x32;
  io::Printer::Print<>(printer,text_01);
  text_02._M_str = "    , pb::IBufferMessage\n";
  text_02._M_len = 0x19;
  io::Printer::Print<>(printer,text_02);
  text_03._M_str = "#endif\n";
  text_03._M_len = 7;
  io::Printer::Print<>(printer,text_03);
  text_04._M_str = "{\n";
  text_04._M_len = 2;
  io::Printer::Print<>(printer,text_04);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_20._M_str =
       "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
  ;
  text_20._M_len = 0x81;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_20);
  text_05._M_str = "private pb::UnknownFieldSet _unknownFields;\n";
  text_05._M_len = 0x2c;
  io::Printer::Print<>(printer,text_05);
  if (this->has_extension_ranges_ == true) {
    psVar2 = this->descriptor_->file_->name_;
    __s1 = (psVar2->_M_dataplus)._M_p;
    sVar3 = psVar2->_M_string_length;
    if (sVar3 == 0x21) {
      iVar9 = bcmp(__s1,"net/proto2/proto/descriptor.proto",0x21);
      if (iVar9 == 0) goto LAB_00e8dae4;
LAB_00e8dad6:
      pcVar16 = "private pb::ExtensionSet<$class_name$> _extensions;\n";
      sVar19 = 0x34;
    }
    else {
      if ((sVar3 != 0x20) ||
         (iVar9 = bcmp(__s1,"google/protobuf/descriptor.proto",0x20), iVar9 != 0))
      goto LAB_00e8dad6;
LAB_00e8dae4:
      pcVar16 = "internal pb::ExtensionSet<$class_name$> _extensions;\n";
      sVar19 = 0x35;
    }
    text_21._M_str = pcVar16;
    text_21._M_len = sVar19;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_21);
    text_22._M_str =
         "private pb::ExtensionSet<$class_name$> _Extensions { get { return _extensions; } }\n";
    text_22._M_len = 0x53;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_22);
  }
  if (0 < this->has_bit_field_count_) {
    iVar9 = 0;
    do {
      ppEVar25 = &enumGenerator.descriptor_;
      pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (iVar9,(Nonnull<char_*>)ppEVar25);
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
           (_func_int **)(pcVar11 + -(long)ppEVar25);
      local_120._0_8_ = local_120 + 0x10;
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)ppEVar25;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,ppEVar25,pcVar11);
      text_06._M_str = "private int _hasBits$i$;\n";
      text_06._M_len = 0x19;
      io::Printer::Print<char[2],std::__cxx11::string>
                (printer,text_06,(char (*) [2])0x1184c8b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->has_bit_field_count_);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_23._M_str =
       "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n";
  text_23._M_len = 0x52;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_23);
  pDVar13 = this->descriptor_;
  if (pDVar13->containing_type_ == (Descriptor *)0x0) {
    GetReflectionClassName_abi_cxx11_((string *)local_f0,(csharp *)pDVar13->file_,descriptor);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)local_f0._8_8_
    ;
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)local_f0._0_8_;
    local_120._0_8_ = (ctrl_t *)0x19;
    local_120._8_8_ = ".Descriptor.MessageTypes[";
    pDVar13 = this->descriptor_;
    if (pDVar13->containing_type_ == (Descriptor *)0x0) {
      ppDVar17 = &pDVar13->file_->message_types_;
    }
    else {
      ppDVar17 = &pDVar13->containing_type_->nested_types_;
    }
    pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        ((int)((ulong)((long)pDVar13 - (long)*ppDVar17) >> 5) * -0x33333333,
                         local_c0[0]._M_local_buf);
    local_d0._M_allocated_capacity = (size_type)(pcVar11 + -(long)local_c0);
    local_60.piece_._M_len = 1;
    local_60.piece_._M_str = "]";
    local_d0._8_8_ = local_c0;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_98,(lts_20250127 *)&enumGenerator,(AlphaNum *)local_120,(AlphaNum *)&local_d0,
               &local_60,(AlphaNum *)in_R9);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[20]>(&local_78,&vars,(char (*) [20])"descriptor_accessor");
  }
  else {
    GetClassName_abi_cxx11_
              ((string *)local_f0,(csharp *)pDVar13->containing_type_,(Descriptor *)descriptor);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)local_f0._8_8_
    ;
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)local_f0._0_8_;
    local_120._0_8_ = &DAT_00000018;
    local_120._8_8_ = ".Descriptor.NestedTypes[";
    pDVar13 = this->descriptor_;
    if (pDVar13->containing_type_ == (Descriptor *)0x0) {
      ppDVar17 = &pDVar13->file_->message_types_;
    }
    else {
      ppDVar17 = &pDVar13->containing_type_->nested_types_;
    }
    pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        ((int)((ulong)((long)pDVar13 - (long)*ppDVar17) >> 5) * -0x33333333,
                         local_c0[0]._M_local_buf);
    local_d0._M_allocated_capacity = (size_type)(pcVar11 + -(long)local_c0);
    local_60.piece_._M_len = 1;
    local_60.piece_._M_str = "]";
    local_d0._8_8_ = local_c0;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_98,(lts_20250127 *)&enumGenerator,(AlphaNum *)local_120,(AlphaNum *)&local_d0,
               &local_60,(AlphaNum *)in_R9);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[20]>(&local_78,&vars,(char (*) [20])"descriptor_accessor");
  }
  std::__cxx11::string::operator=
            ((string *)((long)local_78.first.field_1.slot_ + 0x10),(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((Options *)local_f0._0_8_ != (Options *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_24._M_str =
       "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
  ;
  text_24._M_len = 0x5d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_24);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_25._M_str =
       "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n";
  text_25._M_len = 0x51;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_25);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_26._M_str =
       "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n";
  text_26._M_len = 0x4f;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_26);
  GenerateCloningCode(this,printer);
  pDVar13 = this->descriptor_;
  if (0 < pDVar13->field_count_) {
    lVar23 = 0;
    lVar24 = 0;
    pFVar20 = extraout_RDX;
    do {
      pFVar4 = pDVar13->fields_;
      puVar1 = *(ushort **)((long)&(pFVar4->all_names_).payload_ + lVar23);
      local_60.piece_._M_len = (size_t)*puVar1;
      local_60.piece_._M_str = (char *)(~local_60.piece_._M_len + (long)puVar1);
      GetFieldConstantName_abi_cxx11_
                ((string *)local_120,(csharp *)(&pFVar4->super_SymbolBase + lVar23),pFVar20);
      ppEVar25 = &enumGenerator.descriptor_;
      pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&pFVar4->number_ + lVar23),(Nonnull<char_*>)ppEVar25);
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
           (_func_int **)(pcVar11 + -(long)ppEVar25);
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)ppEVar25;
      local_d0._M_allocated_capacity = (size_type)local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,ppEVar25,pcVar11);
      in_R9 = "field_constant_name";
      text_07._M_str =
           "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
      ;
      text_07._M_len = 0x74;
      io::Printer::
      Print<char[11],std::basic_string_view<char,std::char_traits<char>>,char[20],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,text_07,(char (*) [11])0x13782c1,&local_60.piece_,
                 (char (*) [20])"field_constant_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (char (*) [6])0x1104a3a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_allocated_capacity != local_c0) {
        operator_delete((void *)local_d0._M_allocated_capacity,local_c0[0]._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      pFVar12 = CreateFieldGeneratorInternal
                          (this,(FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar23));
      (*(pFVar12->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[6])(pFVar12,printer);
      text_08._M_str = "\n";
      text_08._M_len = 1;
      io::Printer::Print<>(printer,text_08);
      (*(pFVar12->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
      lVar24 = lVar24 + 1;
      pDVar13 = this->descriptor_;
      lVar23 = lVar23 + 0x58;
      pFVar20 = extraout_RDX_00;
    } while (lVar24 < pDVar13->field_count_);
  }
  pDVar13 = this->descriptor_;
  if (0 < pDVar13->real_oneof_decl_count_) {
    lVar23 = 0;
    do {
      ppEVar25 = &enumGenerator.descriptor_;
      local_a0 = lVar23;
      if (lVar23 < pDVar13->oneof_decl_count_) {
        pcVar14 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar23,(long)pDVar13->oneof_decl_count_,"index < oneof_decl_count()");
      }
      lVar23 = local_a0;
      if (pcVar14 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&enumGenerator,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa89,pcVar14);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&enumGenerator);
      }
      pOVar5 = pDVar13->oneof_decls_;
      puVar1 = (ushort *)pOVar5[local_a0].all_names_.payload_;
      pcVar21 = (csharp *)(ulong)*puVar1;
      input._M_len = (long)puVar1 + ~(ulong)pcVar21;
      input._M_str = (char *)0x0;
      UnderscoresToCamelCase_abi_cxx11_((string *)&enumGenerator,pcVar21,input,false,SUB81(in_R9,0))
      ;
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[5]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)local_120,&vars,(char (*) [5])0x10f3c63);
      std::__cxx11::string::operator=((string *)(local_120._8_8_ + 0x10),(string *)&enumGenerator);
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          ppEVar25) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)&(enumGenerator.descriptor_)->field_0x1);
      }
      puVar1 = (ushort *)pOVar5[lVar23].all_names_.payload_;
      pcVar21 = (csharp *)(ulong)*puVar1;
      input_00._M_len = (long)puVar1 + ~(ulong)pcVar21;
      input_00._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_
                ((string *)&enumGenerator,pcVar21,input_00,false,SUB81(in_R9,0));
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[14]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)local_120,&vars,(char (*) [14])0x136e422);
      std::__cxx11::string::operator=((string *)(local_120._8_8_ + 0x10),(string *)&enumGenerator);
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          ppEVar25) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)&(enumGenerator.descriptor_)->field_0x1);
      }
      puVar1 = (ushort *)pOVar5[lVar23].all_names_.payload_;
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)ppEVar25;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&enumGenerator,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[14]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)local_120,&vars,(char (*) [14])"original_name");
      std::__cxx11::string::operator=((string *)(local_120._8_8_ + 0x10),(string *)&enumGenerator);
      if ((EnumDescriptor **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          ppEVar25) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)&(enumGenerator.descriptor_)->field_0x1);
      }
      text_27._M_str =
           "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
      ;
      text_27._M_len = 0x8e;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_27);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      text_09._M_str = "None = 0,\n";
      text_09._M_len = 10;
      io::Printer::Print<>(printer,text_09);
      if (0 < pOVar5[lVar23].field_count_) {
        lVar24 = 0;
        lVar26 = 0;
        pFVar20 = extraout_RDX_01;
        do {
          pFVar4 = pOVar5[lVar23].fields_;
          GetOneofCaseName_abi_cxx11_
                    ((string *)local_120,(csharp *)(&pFVar4->super_SymbolBase + lVar24),pFVar20);
          ppEVar25 = &enumGenerator.descriptor_;
          pcVar11 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                              (*(int32_t *)((long)&pFVar4->number_ + lVar24),
                               (Nonnull<char_*>)ppEVar25);
          enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
               (_func_int **)(pcVar11 + -(long)ppEVar25);
          local_d0._M_allocated_capacity = (size_type)local_c0;
          enumGenerator.super_SourceGeneratorBase.options_ = (Options *)ppEVar25;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,ppEVar25,pcVar11);
          in_R9 = "index";
          text_10._M_str = "$oneof_case_name$ = $index$,\n";
          text_10._M_len = 0x1d;
          io::Printer::Print<char[16],std::__cxx11::string,char[6],std::__cxx11::string>
                    (printer,text_10,(char (*) [16])"oneof_case_name",(string *)local_120,
                     (char (*) [6])0x1104a3a,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0)
          ;
          pFVar20 = extraout_RDX_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_allocated_capacity != local_c0) {
            operator_delete((void *)local_d0._M_allocated_capacity,
                            local_c0[0]._M_allocated_capacity + 1);
            pFVar20 = extraout_RDX_03;
          }
          if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
            operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
            pFVar20 = extraout_RDX_04;
          }
          lVar26 = lVar26 + 1;
          lVar24 = lVar24 + 0x58;
        } while (lVar26 < pOVar5[lVar23].field_count_);
      }
      io::Printer::Outdent(printer);
      text_11._M_str = "}\n";
      text_11._M_len = 2;
      io::Printer::Print<>(printer,text_11);
      text_28._M_str =
           "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n";
      text_28._M_len = 0x4e;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_28);
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
      text_29._M_str =
           "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
      ;
      text_29._M_len = 0x57;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_29);
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
      text_30._M_str =
           "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
      ;
      text_30._M_len = 0x69;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_30);
      lVar23 = local_a0 + 1;
      pDVar13 = this->descriptor_;
    } while (lVar23 < pDVar13->real_oneof_decl_count_);
  }
  GenerateFrameworkMethods(this,printer);
  GenerateMessageSerializationMethods(this,printer);
  GenerateMergingMethods(this,printer);
  if (this->has_extension_ranges_ == true) {
    text_31._M_str =
         "public TValue GetExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Get(ref _extensions, extension);\n}\npublic pbc::RepeatedField<TValue> GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.GetOrInitialize(ref _extensions, extension);\n}\npublic void SetExtension<TValue>(pb::Extension<$class_name$, TValue> extension, TValue value) {\n  pb::ExtensionSet.Set(ref _extensions, extension, value);\n}\npublic bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  return pb::ExtensionSet.Has(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::Extension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\npublic void ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> extension) {\n  pb::ExtensionSet.Clear(ref _extensions, extension);\n}\n\n"
    ;
    text_31._M_len = 0x450;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_31);
  }
  pDVar13 = this->descriptor_;
  if (pDVar13->enum_type_count_ < 1) {
    uVar15 = (ulong)pDVar13->nested_type_count_;
    bVar27 = 0 < (long)uVar15;
    if (0 < (long)uVar15) {
      if ((pDVar13->nested_types_->options_->field_0)._impl_.map_entry_ != true) goto LAB_00e8e3c5;
      ppMVar18 = &pDVar13->nested_types_[1].options_;
      uVar8 = 1;
      do {
        uVar22 = uVar8;
        if (uVar15 == uVar22) break;
        pMVar7 = *ppMVar18;
        ppMVar18 = ppMVar18 + 0x14;
        uVar8 = uVar22 + 1;
      } while ((pMVar7->field_0)._impl_.map_entry_ != false);
      bVar27 = uVar22 < uVar15;
    }
    if (!bVar27) goto LAB_00e8e531;
  }
LAB_00e8e3c5:
  text_32._M_str =
       "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
  ;
  text_32._M_len = 0x72;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&vars,text_32);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_12._M_str = "public static partial class Types {\n";
  text_12._M_len = 0x24;
  io::Printer::Print<>(printer,text_12);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pDVar13 = this->descriptor_;
  if (0 < pDVar13->enum_type_count_) {
    lVar24 = 0;
    lVar23 = 0;
    do {
      pEVar6 = pDVar13->enum_types_;
      pOVar10 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      EnumGenerator::EnumGenerator
                (&enumGenerator,(EnumDescriptor *)(&pEVar6->super_SymbolBase + lVar24),pOVar10);
      EnumGenerator::Generate(&enumGenerator,printer);
      EnumGenerator::~EnumGenerator(&enumGenerator);
      lVar23 = lVar23 + 1;
      pDVar13 = this->descriptor_;
      lVar24 = lVar24 + 0x58;
    } while (lVar23 < pDVar13->enum_type_count_);
  }
  pDVar13 = this->descriptor_;
  if (0 < pDVar13->nested_type_count_) {
    lVar23 = 0;
    lVar24 = 0;
    do {
      if (*(char *)(*(long *)((long)&pDVar13->nested_types_->options_ + lVar23) + 0x53) == '\0') {
        pDVar13 = this->descriptor_;
        lVar26 = (long)pDVar13->nested_type_count_;
        if (lVar24 < lVar26) {
          pcVar14 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar24,lVar26,"index < nested_type_count()");
        }
        if (pcVar14 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_120,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa8a,pcVar14);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_120);
        }
        pDVar13 = pDVar13->nested_types_;
        pOVar10 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        MessageGenerator((MessageGenerator *)&enumGenerator,
                         (Descriptor *)(&pDVar13->super_SymbolBase + lVar23),pOVar10);
        Generate((MessageGenerator *)&enumGenerator,printer);
        ~MessageGenerator((MessageGenerator *)&enumGenerator);
      }
      lVar24 = lVar24 + 1;
      pDVar13 = this->descriptor_;
      lVar23 = lVar23 + 0xa0;
    } while (lVar24 < pDVar13->nested_type_count_);
  }
  io::Printer::Outdent(printer);
  text_13._M_str = "}\n#endregion\n\n";
  text_13._M_len = 0xe;
  io::Printer::Print<>(printer,text_13);
LAB_00e8e531:
  if (0 < this->descriptor_->extension_count_) {
    text_33._M_str =
         "#region Extensions\n/// <summary>Container for extensions for other messages declared in the $class_name$ message type.</summary>\n"
    ;
    text_33._M_len = 0x81;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_33);
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    text_14._M_str = "public static partial class Extensions {\n";
    text_14._M_len = 0x29;
    io::Printer::Print<>(printer,text_14);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    pDVar13 = this->descriptor_;
    if (0 < pDVar13->extension_count_) {
      lVar23 = 0;
      lVar24 = 0;
      do {
        pFVar12 = CreateFieldGeneratorInternal
                            (this,(FieldDescriptor *)
                                  (&pDVar13->extensions_->super_SymbolBase + lVar23));
        (*(pFVar12->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar12,printer);
        (*(pFVar12->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar12);
        lVar24 = lVar24 + 1;
        pDVar13 = this->descriptor_;
        lVar23 = lVar23 + 0x58;
      } while (lVar24 < pDVar13->extension_count_);
    }
    io::Printer::Outdent(printer);
    text_15._M_str = "}\n#endregion\n\n";
    text_15._M_len = 0xe;
    io::Printer::Print<>(printer,text_15);
  }
  io::Printer::Outdent(printer);
  text_16._M_str = "}\n";
  text_16._M_len = 2;
  io::Printer::Print<>(printer,text_16);
  text_17._M_str = "\n";
  text_17._M_len = 1;
  io::Printer::Print<>(printer,text_17);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&vars);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  AddSerializableAttribute(printer);

  printer->Print(
      "[global::System.Diagnostics.DebuggerDisplayAttribute(\"{ToString(),nq}"
      "\")]\n");
  printer->Print(vars, "$access_level$ sealed partial class $class_name$ : ");

  if (has_extension_ranges_) {
    printer->Print(vars, "pb::IExtendableMessage<$class_name$>\n");
  } else {
    printer->Print(vars, "pb::IMessage<$class_name$>\n");
  }
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Print("    , pb::IBufferMessage\n");
  printer->Print("#endif\n");
  printer->Print("{\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
      vars,
      "private static readonly pb::MessageParser<$class_name$> _parser = new "
      "pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  printer->Print("private pb::UnknownFieldSet _unknownFields;\n");

  if (has_extension_ranges_) {
    if (IsDescriptorProto(descriptor_->file())) {
      printer->Print(vars,
                     // CustomOptions compatibility
                     "internal pb::ExtensionSet<$class_name$> _extensions;\n");
    } else {
      printer->Print(vars,
                     "private pb::ExtensionSet<$class_name$> _extensions;\n");
    }

    // a read-only property for fast
    // retrieval of the set in IsInitialized
    printer->Print(vars,
                   "private pb::ExtensionSet<$class_name$> _Extensions { get { "
                   "return _extensions; } }\n");
  }

  for (int i = 0; i < has_bit_field_count_; i++) {
    // don't use arrays since all arrays are heap allocated, saving allocations
    // use ints instead of bytes since bytes lack bitwise operators, saving
    // casts
    printer->Print("private int _hasBits$i$;\n", "i", absl::StrCat(i));
  }

  WriteGeneratedCodeAttributes(printer);

  printer->Print(vars,
                 "public static pb::MessageParser<$class_name$> Parser { get { "
                 "return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or
  // containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] =
        absl::StrCat(GetReflectionClassName(descriptor_->file()),
                     ".Descriptor.MessageTypes[", descriptor_->index(), "]");
  } else {
    vars["descriptor_accessor"] =
        absl::StrCat(GetClassName(descriptor_->containing_type()),
                     ".Descriptor.NestedTypes[", descriptor_->index(), "]");
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public static pbr::MessageDescriptor Descriptor {\n"
                 "  get { return $descriptor_accessor$; }\n"
                 "}\n"
                 "\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
                 "  get { return Descriptor; }\n"
                 "}\n"
                 "\n");

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(vars,
                 "public $class_name$() {\n"
                 "  OnConstruction();\n"
                 "}\n\n"
                 "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
        "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
        "public const int $field_constant_name$ = $index$;\n",
        "field_name", fieldDescriptor->name(), "field_constant_name",
        GetFieldConstantName(fieldDescriptor), "index",
        absl::StrCat(fieldDescriptor->number()));
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties (for real oneofs, which come before synthetic ones)
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    vars["original_name"] = std::string(oneof->name());
    printer->Print(vars,
                   "private object $name$_;\n"
                   "/// <summary>Enum of possible cases for the "
                   "\"$original_name$\" oneof.</summary>\n"
                   "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print("$oneof_case_name$ = $index$,\n", "oneof_case_name",
                     GetOneofCaseName(field), "index",
                     absl::StrCat(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
    printer->Print(vars,
                   "private $property_name$OneofCase $name$Case_ = "
                   "$property_name$OneofCase.None;\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(vars,
                   "public $property_name$OneofCase $property_name$Case {\n"
                   "  get { return $name$Case_; }\n"
                   "}\n\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(vars,
                   "public void Clear$property_name$() {\n"
                   "  $name$Case_ = $property_name$OneofCase.None;\n"
                   "  $name$_ = null;\n"
                   "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  if (has_extension_ranges_) {
    printer->Print(
        vars,
        "public TValue GetExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Get(ref _extensions, extension);\n"
        "}\n"
        "public pbc::RepeatedField<TValue> "
        "GetOrInitializeExtension<TValue>(pb::RepeatedExtension<$class_name$, "
        "TValue> extension) {\n"
        "  return pb::ExtensionSet.GetOrInitialize(ref _extensions, "
        "extension);\n"
        "}\n"
        "public void SetExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension, TValue value) {\n"
        "  pb::ExtensionSet.Set(ref _extensions, extension, value);\n"
        "}\n"
        "public bool HasExtension<TValue>(pb::Extension<$class_name$, TValue> "
        "extension) {\n"
        "  return pb::ExtensionSet.Has(ref _extensions, extension);\n"
        "}\n"
        "public void ClearExtension<TValue>(pb::Extension<$class_name$, "
        "TValue> extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n"
        "public void "
        "ClearExtension<TValue>(pb::RepeatedExtension<$class_name$, TValue> "
        "extension) {\n"
        "  pb::ExtensionSet.Clear(ref _extensions, extension);\n"
        "}\n\n");
  }

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(vars,
                   "#region Nested types\n"
                   "/// <summary>Container for nested types declared in the "
                   "$class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(descriptor_->nested_type(i),
                                          this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print(
        "}\n"
        "#endregion\n"
        "\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print(vars,
                   "#region Extensions\n"
                   "/// <summary>Container for extensions for other messages "
                   "declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Extensions {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->extension_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
          CreateFieldGeneratorInternal(descriptor_->extension(i)));
      generator->GenerateExtensionCode(printer);
    }
    printer->Outdent();
    printer->Print(
        "}\n"
        "#endregion\n"
        "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}